

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTree.c
# Opt level: O3

int Vec_StrGets(char *pBuffer,int nBufferSize,Vec_Str_t *vStr,int *pPos)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  
  if (nBufferSize < 2) {
    __assert_fail("nBufferSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTree.c"
                  ,0x141,"int Vec_StrGets(char *, int, Vec_Str_t *, int *)");
  }
  pcVar4 = vStr->pArray;
  iVar2 = *pPos;
  pcVar7 = pcVar4 + iVar2;
  iVar3 = vStr->nSize;
  if (iVar2 == iVar3) {
    *pBuffer = '\0';
  }
  else {
    if (iVar3 <= iVar2) {
      __assert_fail("pBeg < pEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mapper/mapperTree.c"
                    ,0x147,"int Vec_StrGets(char *, int, Vec_Str_t *, int *)");
    }
    pcVar6 = pBuffer + 1;
    lVar5 = 0;
    do {
      cVar1 = *pcVar7;
      pcVar6[-1] = cVar1;
      if (cVar1 == '\n') {
        *pPos = (*pPos - (int)lVar5) + 1;
LAB_00367c46:
        *pcVar6 = '\0';
        return 1;
      }
      if (cVar1 == '\0') {
        *pPos = *pPos - (int)lVar5;
        return 0;
      }
      if (-lVar5 == (ulong)(nBufferSize - 1)) {
        *pPos = *pPos + nBufferSize;
        goto LAB_00367c46;
      }
      pcVar7 = pcVar7 + 1;
      pcVar6 = pcVar6 + 1;
      lVar5 = lVar5 + -1;
    } while (pcVar7 < pcVar4 + iVar3);
  }
  return 0;
}

Assistant:

int Vec_StrGets( char * pBuffer, int nBufferSize, Vec_Str_t * vStr, int * pPos )
{
    char * pCur;
    char * pBeg = Vec_StrArray(vStr) + *pPos;
    char * pEnd = Vec_StrArray(vStr) + Vec_StrSize(vStr);
    assert( nBufferSize > 1 );
    if ( pBeg == pEnd )
    {
        *pBuffer = 0;
        return 0;
    }
    assert( pBeg < pEnd );
    for ( pCur = pBeg; pCur < pEnd; pCur++ )
    {
        *pBuffer++ = *pCur;
        if ( *pCur == 0 )
        {
            *pPos += pCur - pBeg;
            return 0;
        }
        if ( *pCur == '\n' )
        {
            *pPos += pCur - pBeg + 1;
            *pBuffer = 0;
            return 1;
        }
        if ( pCur - pBeg == nBufferSize-1 )
        {
            *pPos += pCur - pBeg + 1;
            *pBuffer = 0;
            return 1;
        }
    }
    return 0;
}